

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O2

void __thiscall MIDIplay::noteUpdateAll(MIDIplay *this,size_t midCh,uint props_mask)

{
  pl_cell<MIDIplay::MIDIchannel::NoteInfo> *ppVar1;
  notes_iterator i;
  
  i.cell_ = (this->m_midiChannels).
            super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
            _M_impl.super__Vector_impl_data._M_start[midCh].activenotes.first_;
  while (ppVar1 = ((i.cell_)->super_pl_basic_cell<MIDIplay::MIDIchannel::NoteInfo>).next,
        ppVar1 != (pl_cell<MIDIplay::MIDIchannel::NoteInfo> *)0x0) {
    noteUpdate(this,midCh,i,props_mask,-1);
    i.cell_ = ppVar1;
  }
  return;
}

Assistant:

void MIDIplay::noteUpdateAll(size_t midCh, unsigned props_mask)
{
    for(MIDIchannel::notes_iterator
        i = m_midiChannels[midCh].activenotes.begin(); !i.is_end();)
    {
        MIDIchannel::notes_iterator j(i++);
        noteUpdate(midCh, j, props_mask);
    }
}